

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.c
# Opt level: O3

_Bool upb_Message_IsEqual(upb_Message *msg1,upb_Message *msg2,upb_MiniTable *m,int options)

{
  byte bVar1;
  byte bVar2;
  undefined4 uVar3;
  upb_MiniTableField *puVar4;
  long lVar5;
  upb_Array *arr1;
  size_t __n;
  upb_Array *arr2;
  undefined8 map;
  undefined8 map_00;
  _Bool _Var6;
  _Bool _Var7;
  bool bVar8;
  uint uVar9;
  upb_UnknownCompareResult uVar10;
  size_t sVar11;
  upb_Extension *puVar12;
  size_t sVar13;
  ulong uVar14;
  upb_MiniTable *puVar15;
  upb_CType uVar16;
  uint *puVar17;
  ulong uVar18;
  long *plVar19;
  upb_MiniTableExtension *e;
  upb_MessageValue val1;
  upb_MiniTableField *f2;
  upb_MiniTableField *f1;
  size_t iter2;
  size_t iter1;
  upb_MessageValue val1_1;
  upb_MessageValue key;
  upb_MessageValue val2;
  upb_MessageValue local_a8;
  upb_MessageValue local_98;
  upb_MiniTableField *local_88;
  upb_MiniTableField *local_80;
  size_t local_78;
  size_t local_70;
  size_t local_68;
  upb_MessageValue local_60;
  upb_MessageValue local_50;
  upb_MessageValue local_40;
  
  _Var6 = true;
  if (msg1 != msg2) {
    local_68 = 0xffffffffffffffff;
    local_70 = 0xffffffffffffffff;
    _Var6 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                      (msg1,m,&local_80,&local_98,&local_68);
    _Var7 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                      (msg2,m,&local_88,&local_a8,&local_70);
    if (_Var6 && _Var7) {
      do {
        map_00 = local_98.double_val;
        map = local_a8.double_val;
        if (local_80 != local_88) goto LAB_002f3a82;
        bVar1 = local_80->descriptortype_dont_copy_me__upb_internal_use_only;
        bVar2 = local_80->mode_dont_copy_me__upb_internal_use_only;
        if ((bVar2 & 0x10) == 0) {
          uVar14 = (ulong)(bVar1 - 1);
          if (1 < uVar14 - 9) goto LAB_002f359a;
          puVar15 = *m->subs_dont_copy_me__upb_internal_use_only
                     [local_80->submsg_index_dont_copy_me__upb_internal_use_only].
                     submsg_dont_copy_me__upb_internal_use_only;
          uVar16 = *(upb_CType *)(upb_FieldType_CType_c_type + uVar14 * 4);
          switch(bVar2 & 3) {
          case 0:
            goto switchD_002f357d_caseD_0;
          case 1:
            goto switchD_002f357d_caseD_1;
          case 2:
            goto switchD_002f357d_caseD_2;
          }
          goto switchD_002f357d_caseD_3;
        }
        if (bVar1 == 5) {
          uVar14 = 0xd;
        }
        else {
          if (bVar1 != 0xc) goto LAB_002f3ab5;
          uVar14 = 8;
        }
LAB_002f359a:
        puVar15 = (upb_MiniTable *)0x0;
        uVar16 = *(upb_CType *)(upb_FieldType_CType_c_type + uVar14 * 4);
        switch(bVar2 & 3) {
        case 0:
switchD_002f357d_caseD_0:
          if (local_98.int64_val != local_a8.int64_val) {
            if (local_98._0_8_ == (upb_Map *)0x0) {
              sVar11 = 0;
            }
            else {
              sVar11 = upb_Map_Size(local_98.map_val);
            }
            if ((upb_Map *)map == (upb_Map *)0x0) {
              sVar13 = 0;
            }
            else {
              sVar13 = upb_Map_Size((upb_Map *)map);
            }
            if (sVar11 != sVar13) goto LAB_002f3a82;
            if (puVar15->field_count_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTable_FieldCount(m) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa5,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            puVar4 = puVar15->fields_dont_copy_me__upb_internal_use_only;
            if (puVar4[1].number_dont_copy_me__upb_internal_use_only != 2) {
              __assert_fail("upb_MiniTableField_Number(f) == 2",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/message.h"
                            ,0xa7,
                            "const struct upb_MiniTableField *upb_MiniTable_MapValue(const struct upb_MiniTable *)"
                           );
            }
            bVar1 = puVar4[1].descriptortype_dont_copy_me__upb_internal_use_only;
            if ((puVar4[1].mode_dont_copy_me__upb_internal_use_only & 0x10) == 0) {
              uVar14 = (ulong)(bVar1 - 1);
              if (1 < uVar14 - 9) goto LAB_002f36f1;
              puVar15 = *puVar15->subs_dont_copy_me__upb_internal_use_only
                         [puVar4[1].submsg_index_dont_copy_me__upb_internal_use_only].
                         submsg_dont_copy_me__upb_internal_use_only;
            }
            else {
              if (bVar1 == 5) {
                uVar14 = 0xd;
              }
              else {
                if (bVar1 != 0xc) goto LAB_002f3ab5;
                uVar14 = 8;
              }
LAB_002f36f1:
              puVar15 = (upb_MiniTable *)0x0;
            }
            uVar3 = *(undefined4 *)(upb_FieldType_CType_c_type + uVar14 * 4);
            local_78 = 0xffffffffffffffff;
            _Var6 = upb_Map_Next((upb_Map *)map_00,&local_50,&local_60,&local_78);
            if (_Var6) {
              do {
                _Var6 = upb_Map_Get((upb_Map *)map,local_50,&local_40);
                if (!_Var6) goto LAB_002f3a82;
                switch(uVar3) {
                case 1:
                  uVar9 = ((uint)local_40.uint64_val ^ (uint)local_60.uint64_val) & 1;
joined_r0x002f37a7:
                  if (uVar9 != 0) goto LAB_002f3a82;
                  break;
                case 2:
                case 3:
                case 4:
                case 5:
                  if ((uint)local_60.uint64_val != (uint)local_40.uint64_val) goto LAB_002f3a82;
                  break;
                case 6:
                  _Var6 = upb_Message_IsEqual(local_60.msg_val,local_40.msg_val,puVar15,options);
                  if (!_Var6) goto LAB_002f3a82;
                  break;
                case 7:
                case 8:
                case 9:
                  if (local_60.int64_val != local_40.int64_val) goto LAB_002f3a82;
                  break;
                case 10:
                case 0xb:
                  if (local_60.str_val.size != local_40.str_val.size) goto LAB_002f3a82;
                  if (local_60.str_val.size != 0) {
                    uVar9 = bcmp(local_60.array_val,local_40.array_val,local_60.str_val.size);
                    goto joined_r0x002f37a7;
                  }
                  break;
                default:
                  goto switchD_002f3628_default;
                }
                _Var6 = upb_Map_Next((upb_Map *)map_00,&local_50,&local_60,&local_78);
              } while (_Var6);
            }
          }
        case 3:
switchD_002f357d_caseD_3:
          break;
        case 1:
switchD_002f357d_caseD_1:
          bVar8 = _upb_Array_IsEqual(local_98.array_val,local_a8.array_val,uVar16,puVar15,options);
joined_r0x002f384a:
          if (bVar8) break;
          goto LAB_002f3a82;
        case 2:
switchD_002f357d_caseD_2:
          switch(uVar16) {
          case kUpb_CType_Bool:
            uVar9 = ((uint)local_a8.uint64_val ^ (uint)local_98.uint64_val) & 1;
            goto joined_r0x002f36e1;
          case kUpb_CType_Float:
          case kUpb_CType_Int32:
          case kUpb_CType_UInt32:
          case kUpb_CType_Enum:
            if ((uint)local_98.uint64_val == (uint)local_a8.uint64_val) break;
            goto LAB_002f3a82;
          case kUpb_CType_Message:
            bVar8 = upb_Message_IsEqual(local_98.msg_val,local_a8.msg_val,puVar15,options);
            goto joined_r0x002f384a;
          case kUpb_CType_Double:
          case kUpb_CType_Int64:
          case kUpb_CType_UInt64:
            if (local_98.int64_val != local_a8.int64_val) goto LAB_002f3a82;
            break;
          case kUpb_CType_String:
          case kUpb_CType_Bytes:
            if (local_98.str_val.size != local_a8.str_val.size) goto LAB_002f3a82;
            if (local_98.str_val.size == 0) goto switchD_002f357d_caseD_3;
            uVar9 = bcmp(local_98.array_val,local_a8.array_val,local_98.str_val.size);
joined_r0x002f36e1:
            if (uVar9 != 0) goto LAB_002f3a82;
            break;
          default:
            goto switchD_002f3628_default;
          }
        }
        _Var6 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                          (msg1,m,&local_80,&local_98,&local_68);
        _Var7 = _upb_Message_NextBaseField_dont_copy_me__upb_internal_use_only
                          (msg2,m,&local_88,&local_a8,&local_70);
      } while ((_Var6) && (_Var7));
    }
    if (_Var6 == _Var7) {
      sVar11 = 0;
      puVar17 = (uint *)((msg1->field_0).internal_opaque & 0xfffffffffffffffe);
      if (puVar17 != (uint *)0x0) {
        uVar14 = 0;
        do {
          uVar18 = (ulong)*puVar17;
          if (uVar18 <= uVar14) break;
LAB_002f388e:
          uVar14 = uVar14 + 1;
          if ((*(ulong *)(puVar17 + uVar14 * 2) & 1) == 0) {
LAB_002f38df:
            if (uVar18 <= uVar14) break;
            goto LAB_002f388e;
          }
          plVar19 = (long *)(*(ulong *)(puVar17 + uVar14 * 2) & 0xfffffffffffffffc);
          e = (upb_MiniTableExtension *)*plVar19;
          switch((e->field_dont_copy_me__upb_internal_use_only).
                 mode_dont_copy_me__upb_internal_use_only & 3) {
          case 1:
            if (*(long *)(plVar19[1] + 8) != 0) goto switchD_002f38af_caseD_2;
            goto LAB_002f38df;
          case 2:
            goto switchD_002f38af_caseD_2;
          case 3:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/extension.h"
                          ,0x3f,
                          "_Bool _upb_Extension_IsEmpty_dont_copy_me__upb_internal_use_only(const upb_Extension *)"
                         );
          }
          lVar5 = plVar19[1];
          if (*(char *)(lVar5 + 3) == '\x01') {
            uVar18 = (ulong)*(uint *)(lVar5 + 0x10);
          }
          else {
            uVar18 = upb_inttable_count((upb_inttable *)(lVar5 + 8));
          }
          if (uVar18 == 0) {
            uVar18 = (ulong)*puVar17;
            goto LAB_002f38df;
          }
          e = (upb_MiniTableExtension *)*plVar19;
switchD_002f38af_caseD_2:
          arr1 = (upb_Array *)plVar19[1];
          __n = plVar19[2];
          puVar12 = _upb_Message_Getext_dont_copy_me__upb_internal_use_only(msg2,e);
          if (puVar12 == (upb_Extension *)0x0) goto LAB_002f3a82;
          arr2 = (puVar12->data).array_val;
          bVar1 = (e->field_dont_copy_me__upb_internal_use_only).
                  descriptortype_dont_copy_me__upb_internal_use_only;
          bVar2 = (e->field_dont_copy_me__upb_internal_use_only).
                  mode_dont_copy_me__upb_internal_use_only;
          if ((bVar1 & 0xfe) == 10) {
            if ((bVar2 & 0x10) != 0) {
LAB_002f3ab5:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                            ,0x7b,
                            "upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)"
                           );
            }
            if (1 < (ulong)(bVar1 - 1 & 0xb) - 9) goto LAB_002f3952;
            puVar15 = (e->sub_dont_copy_me__upb_internal_use_only).
                      submsg_dont_copy_me__upb_internal_use_only;
          }
          else {
LAB_002f3952:
            puVar15 = (upb_MiniTable *)0x0;
          }
          if ((bVar2 & 0x10) == 0) {
            uVar18 = (ulong)(bVar1 - 1);
LAB_002f39a6:
            uVar16 = *(upb_CType *)(upb_FieldType_CType_c_type + uVar18 * 4);
            switch(bVar2 & 3) {
            case 0:
switchD_002f39c2_caseD_0:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/compare.c"
                            ,0xa2,
                            "_Bool _upb_Message_ExtensionsAreEqual(const upb_Message *, const upb_Message *, const upb_MiniTable *, int)"
                           );
            case 1:
switchD_002f39c2_caseD_1:
              _Var6 = _upb_Array_IsEqual(arr1,arr2,uVar16,puVar15,options);
LAB_002f39d1:
              if (_Var6 == false) goto LAB_002f3a82;
              break;
            case 2:
switchD_002f39c2_caseD_2:
              switch(uVar16) {
              case kUpb_CType_Bool:
                uVar9 = ((uint)arr2 ^ (uint)arr1) & 1;
joined_r0x002f3a1c:
                if (uVar9 != 0) goto LAB_002f3a82;
                break;
              case kUpb_CType_Float:
              case kUpb_CType_Int32:
              case kUpb_CType_UInt32:
              case kUpb_CType_Enum:
                if ((uint)arr1 != (uint)arr2) goto LAB_002f3a82;
                break;
              case kUpb_CType_Message:
                _Var6 = upb_Message_IsEqual((upb_Message *)arr1,(upb_Message *)arr2,puVar15,options)
                ;
                goto LAB_002f39d1;
              case kUpb_CType_Double:
              case kUpb_CType_Int64:
              case kUpb_CType_UInt64:
                if (arr1 != arr2) goto LAB_002f3a82;
                break;
              case kUpb_CType_String:
              case kUpb_CType_Bytes:
                if (__n != (puVar12->data).str_val.size) goto LAB_002f3a82;
                if (__n != 0) {
                  uVar9 = bcmp(arr1,arr2,__n);
                  goto joined_r0x002f3a1c;
                }
                break;
              default:
switchD_002f3628_default:
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/compare.h"
                              ,0x46,
                              "_Bool upb_MessageValue_IsEqual(upb_MessageValue, upb_MessageValue, upb_CType, const upb_MiniTable *, int)"
                             );
              }
            }
          }
          else {
            uVar18 = 0xd;
            if (bVar1 == 5) goto LAB_002f39a6;
            if (bVar1 != 0xc) goto LAB_002f3ab5;
            uVar16 = 10;
            switch(bVar2 & 3) {
            case 0:
              goto switchD_002f39c2_caseD_0;
            case 1:
              goto switchD_002f39c2_caseD_1;
            case 2:
              goto switchD_002f39c2_caseD_2;
            }
          }
          sVar11 = sVar11 + 1;
          puVar17 = (uint *)((msg1->field_0).internal_opaque & 0xfffffffffffffffe);
        } while (puVar17 != (uint *)0x0);
      }
      sVar13 = upb_Message_ExtensionCount(msg2);
      if (sVar11 == sVar13) {
        if ((options & 1U) == 0) {
          return true;
        }
        uVar10 = _upb_Message_UnknownFieldsAreEqual_dont_copy_me__upb_internal_use_only
                           (msg1,msg2,100);
        return uVar10 == kUpb_UnknownCompareResult_Equal;
      }
    }
LAB_002f3a82:
    _Var6 = false;
  }
  return _Var6;
}

Assistant:

bool upb_Message_IsEqual(const upb_Message* msg1, const upb_Message* msg2,
                         const upb_MiniTable* m, int options) {
  if (UPB_UNLIKELY(msg1 == msg2)) return true;

  if (!_upb_Message_BaseFieldsAreEqual(msg1, msg2, m, options)) return false;
  if (!_upb_Message_ExtensionsAreEqual(msg1, msg2, m, options)) return false;

  if (!(options & kUpb_CompareOption_IncludeUnknownFields)) return true;

  // The wire encoder enforces a maximum depth of 100 so we match that here.
  return UPB_PRIVATE(_upb_Message_UnknownFieldsAreEqual)(msg1, msg2, 100) ==
         kUpb_UnknownCompareResult_Equal;
}